

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

void __thiscall
kj::
Table<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Callbacks>_>
::eraseImpl(Table<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Callbacks>_>
            *this,size_t pos)

{
  size_t oldPos;
  Entry *pEVar1;
  Entry *pEVar2;
  ClientHook *pCVar3;
  RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *pRVar4;
  HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks> *indexObj;
  ArrayPtr<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> table;
  ArrayPtr<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> table_00;
  
  pEVar1 = (this->rows).builder.ptr;
  table.size_ = (long)(this->rows).builder.pos - (long)pEVar1 >> 4;
  table.ptr = (Entry *)pEVar1;
  HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks>::
  erase<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry,capnp::ClientHook*&>
            ((HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks> *)
             &this->indexes,table,pos,&pEVar1[pos].key);
  pEVar1 = (this->rows).builder.ptr;
  pRVar4 = (this->rows).builder.pos;
  table_00.size_ = (long)pRVar4 - (long)pEVar1 >> 4;
  oldPos = table_00.size_ - 1;
  if (oldPos != pos) {
    table_00.ptr = (Entry *)pEVar1;
    HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks>::
    move<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry,capnp::ClientHook*&>
              ((HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks> *)
               &this->indexes,table_00,oldPos,pos,&pEVar1[oldPos].key);
    pEVar2 = (this->rows).builder.ptr;
    pEVar1 = pEVar2 + oldPos;
    pCVar3 = pEVar1->value;
    pEVar2 = pEVar2 + pos;
    pEVar2->key = pEVar1->key;
    pEVar2->value = pCVar3;
    pRVar4 = (this->rows).builder.pos;
  }
  (this->rows).builder.pos = pRVar4 + -1;
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}